

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AccountID.cpp
# Opt level: O0

string * __thiscall
jbcoin::AccountIDCache::toBase58_abi_cxx11_
          (string *__return_storage_ptr__,AccountIDCache *this,AccountID *id)

{
  bool bVar1;
  pointer ppVar2;
  size_type sVar3;
  AccountID *v;
  hash_map<AccountID,_std::string> *this_00;
  string local_98;
  _Node_iterator_base<std::pair<const_jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_78;
  _Node_iterator_base<std::pair<const_jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_70;
  _Node_iterator_base<std::pair<const_jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_68;
  undefined1 local_59;
  _Node_iterator_base<std::pair<const_jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_58;
  undefined4 local_4c;
  _Node_iterator_base<std::pair<const_jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_48 [3];
  _Node_iterator_base<std::pair<const_jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_30;
  iterator iter;
  lock_guard<std::mutex> lock;
  AccountID *id_local;
  AccountIDCache *this_local;
  string *result;
  
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&iter,&this->mutex_);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_beast::uhash<beast::spooky>,_std::equal_to<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_>,_std::allocator<std::pair<const_jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->m1_,id);
  local_48[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_beast::uhash<beast::spooky>,_std::equal_to<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_>,_std::allocator<std::pair<const_jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->m1_);
  bVar1 = std::__detail::operator!=(&local_30,local_48);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                           *)&local_30);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&ppVar2->second);
  }
  else {
    local_58._M_cur =
         (__node_type *)
         std::
         unordered_map<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_beast::uhash<beast::spooky>,_std::equal_to<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_>,_std::allocator<std::pair<const_jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(&this->m0_,id);
    local_59 = 0;
    local_30._M_cur = local_58._M_cur;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    local_68._M_cur =
         (__node_type *)
         std::
         unordered_map<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_beast::uhash<beast::spooky>,_std::equal_to<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_>,_std::allocator<std::pair<const_jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&this->m0_);
    bVar1 = std::__detail::operator!=(&local_30,&local_68);
    if (bVar1) {
      ppVar2 = std::__detail::
               _Node_iterator<std::pair<const_jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                             *)&local_30);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&ppVar2->second);
      local_70._M_cur = local_30._M_cur;
      local_78._M_cur =
           (__node_type *)
           std::
           unordered_map<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_beast::uhash<beast::spooky>,_std::equal_to<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_>,_std::allocator<std::pair<const_jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::erase(&this->m0_,local_30._M_cur);
    }
    else {
      jbcoin::toBase58_abi_cxx11_(&local_98,(jbcoin *)id,v);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
    }
    sVar3 = std::
            unordered_map<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_beast::uhash<beast::spooky>,_std::equal_to<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_>,_std::allocator<std::pair<const_jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::size(&this->m1_);
    if (this->capacity_ <= sVar3) {
      this_00 = &this->m1_;
      std::
      unordered_map<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_beast::uhash<beast::spooky>,_std::equal_to<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_>,_std::allocator<std::pair<const_jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator=(&this->m0_,this_00);
      std::
      unordered_map<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_beast::uhash<beast::spooky>,_std::equal_to<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_>,_std::allocator<std::pair<const_jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::clear(this_00);
      std::
      unordered_map<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_beast::uhash<beast::spooky>,_std::equal_to<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_>,_std::allocator<std::pair<const_jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::reserve(this_00,this->capacity_);
    }
    std::
    unordered_map<jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>,std::__cxx11::string,beast::uhash<beast::spooky>,std::equal_to<jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>>,std::allocator<std::pair<jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>const,std::__cxx11::string>>>
    ::emplace<jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>const&,std::__cxx11::string&>
              ((unordered_map<jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>,std::__cxx11::string,beast::uhash<beast::spooky>,std::equal_to<jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>>,std::allocator<std::pair<jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>const,std::__cxx11::string>>>
                *)&this->m1_,id,__return_storage_ptr__);
    local_59 = 1;
  }
  local_4c = 1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&iter);
  return __return_storage_ptr__;
}

Assistant:

std::string
AccountIDCache::toBase58(
    AccountID const& id) const
{
    std::lock_guard<
        std::mutex> lock(mutex_);
    auto iter = m1_.find(id);
    if (iter != m1_.end())
        return iter->second;
    iter = m0_.find(id);
    std::string result;
    if (iter != m0_.end())
    {
        result = iter->second;
        // Can use insert-only hash maps if
        // we didn't erase from here.
        m0_.erase(iter);
    }
    else
    {
        result =
            jbcoin::toBase58(id);
    }
    if (m1_.size() >= capacity_)
    {
        m0_ = std::move(m1_);
        m1_.clear();
        m1_.reserve(capacity_);
    }
    m1_.emplace(id, result);
    return result;
}